

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaFreeAttributeUse(xmlSchemaAttributeUsePtr_conflict use)

{
  xmlSchemaAttributeUsePtr_conflict use_local;
  
  if (use != (xmlSchemaAttributeUsePtr_conflict)0x0) {
    if (use->annot != (xmlSchemaAnnotPtr)0x0) {
      xmlSchemaFreeAnnot(use->annot);
    }
    if (use->defVal != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(use->defVal);
    }
    (*xmlFree)(use);
  }
  return;
}

Assistant:

static void
xmlSchemaFreeAttributeUse(xmlSchemaAttributeUsePtr use)
{
    if (use == NULL)
        return;
    if (use->annot != NULL)
	xmlSchemaFreeAnnot(use->annot);
    if (use->defVal != NULL)
	xmlSchemaFreeValue(use->defVal);
    xmlFree(use);
}